

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

SignatureData * DataFromTransaction(CMutableTransaction *tx,uint nIn,CTxOut *txout)

{
  Span<const_unsigned_char> _vch;
  bool bVar1;
  TxoutType TVar2;
  TxoutType TVar3;
  size_type sVar4;
  uint in_EDX;
  SignatureData *in_RDI;
  long in_FS_OFFSET;
  valtype *pubkey;
  uint i;
  valtype *sig;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__range2;
  uint last_success_key;
  uint num_pubkeys;
  SigVersion sigversion;
  TxoutType script_type;
  SignatureData *data;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solutions;
  SignatureExtractorChecker extractor_checker;
  MutableTransactionSignatureChecker tx_checker;
  Stacks stack;
  CScript witness_script;
  CScript redeem_script;
  CScript next_script;
  undefined4 in_stack_fffffffffffffd98;
  MissingDataBehavior in_stack_fffffffffffffd9c;
  SignatureData *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined2 in_stack_fffffffffffffdac;
  undefined1 in_stack_fffffffffffffdae;
  undefined1 in_stack_fffffffffffffdaf;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffdb0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffdb8;
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  *pmVar5;
  CPubKey *in_stack_fffffffffffffdc0;
  SignatureData *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined1 *in_stack_fffffffffffffde8;
  CScript *scriptCode;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 uVar6;
  SignatureData *this;
  uint local_1e4;
  SignatureData *in_stack_fffffffffffffe28;
  uint local_1d0;
  ScriptError *in_stack_fffffffffffffe40;
  BaseSignatureChecker *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  uint flags;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  CScript *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined1 local_f0 [200];
  long local_8;
  
  flags = (uint)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  SignatureData::SignatureData(in_stack_fffffffffffffe28);
  sVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  if (sVar4 <= in_EDX) {
    __assert_fail("tx.vin.size() > nIn",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/sign.cpp"
                  ,0x265,
                  "SignatureData DataFromTransaction(const CMutableTransaction &, unsigned int, const CTxOut &)"
                 );
  }
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT17(in_stack_fffffffffffffdaf,
                      CONCAT16(in_stack_fffffffffffffdae,
                               CONCAT24(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))),
             (size_type)in_stack_fffffffffffffda0);
  CScript::operator=((CScript *)
                     CONCAT17(in_stack_fffffffffffffdaf,
                              CONCAT16(in_stack_fffffffffffffdae,
                                       CONCAT24(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
                                      )),(CScript *)in_stack_fffffffffffffda0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT17(in_stack_fffffffffffffdaf,
                      CONCAT16(in_stack_fffffffffffffdae,
                               CONCAT24(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))),
             (size_type)in_stack_fffffffffffffda0);
  CScriptWitness::operator=
            ((CScriptWitness *)
             CONCAT17(in_stack_fffffffffffffdaf,
                      CONCAT16(in_stack_fffffffffffffdae,
                               CONCAT24(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))),
             (CScriptWitness *)in_stack_fffffffffffffda0);
  anon_unknown.dwarf_2a5940::Stacks::Stacks
            ((Stacks *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             in_stack_fffffffffffffdd8);
  GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
            ((GenericTransactionSignatureChecker<CMutableTransaction> *)
             in_stack_fffffffffffffdb8._M_current,
             (CMutableTransaction *)in_stack_fffffffffffffdb0._M_current,
             CONCAT13(in_stack_fffffffffffffdaf,
                      CONCAT12(in_stack_fffffffffffffdae,in_stack_fffffffffffffdac)),
             (CAmount *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
  anon_unknown.dwarf_2a5940::SignatureExtractorChecker::SignatureExtractorChecker
            ((SignatureExtractorChecker *)
             CONCAT17(in_stack_fffffffffffffdaf,
                      CONCAT16(in_stack_fffffffffffffdae,
                               CONCAT24(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))),
             in_stack_fffffffffffffda0,
             (BaseSignatureChecker *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  bVar1 = VerifyScript(in_stack_fffffffffffffe68,
                       (CScript *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       (CScriptWitness *)
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),flags,
                       in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdfc);
  if (bVar1) {
    in_RDI->complete = true;
  }
  else {
    scriptCode = (CScript *)&stack0xfffffffffffffeb8;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    TVar2 = Solver((CScript *)in_stack_fffffffffffffec8,
                   (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffec0);
    TVar3 = TVar2;
    CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                     (CScript *)0x2c1b2f);
    if ((TVar3 == SCRIPTHASH) &&
       (bVar1 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::empty((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffdaf,
                                    CONCAT16(in_stack_fffffffffffffdae,
                                             CONCAT24(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8)))), !bVar1)) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT17(in_stack_fffffffffffffdaf,
                                  CONCAT16(in_stack_fffffffffffffdae,
                                           CONCAT24(in_stack_fffffffffffffdac,
                                                    in_stack_fffffffffffffda8))));
      if (!bVar1) {
        in_stack_fffffffffffffde8 = local_f0;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffda0);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffda0);
        CScript::
        CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((CScript *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
        CScript::operator=((CScript *)
                           CONCAT17(in_stack_fffffffffffffdaf,
                                    CONCAT16(in_stack_fffffffffffffdae,
                                             CONCAT24(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8))),
                           (CScript *)in_stack_fffffffffffffda0);
        CScript::operator=((CScript *)
                           CONCAT17(in_stack_fffffffffffffdaf,
                                    CONCAT16(in_stack_fffffffffffffdae,
                                             CONCAT24(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8))),
                           (CScript *)in_stack_fffffffffffffda0);
        TVar3 = Solver((CScript *)in_stack_fffffffffffffec8,
                       (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)in_stack_fffffffffffffec0);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::pop_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      }
    }
    if ((TVar3 == WITNESS_V0_SCRIPTHASH) &&
       (bVar1 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::empty((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffdaf,
                                    CONCAT16(in_stack_fffffffffffffdae,
                                             CONCAT24(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8)))), !bVar1)) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT17(in_stack_fffffffffffffdaf,
                                  CONCAT16(in_stack_fffffffffffffdae,
                                           CONCAT24(in_stack_fffffffffffffdac,
                                                    in_stack_fffffffffffffda8))));
      if (!bVar1) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffda0);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffda0);
        CScript::
        CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((CScript *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
        CScript::operator=((CScript *)
                           CONCAT17(in_stack_fffffffffffffdaf,
                                    CONCAT16(in_stack_fffffffffffffdae,
                                             CONCAT24(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8))),
                           (CScript *)in_stack_fffffffffffffda0);
        in_stack_fffffffffffffdc0 = (CPubKey *)&stack0xffffffffffffffd8;
        CScript::operator=((CScript *)
                           CONCAT17(in_stack_fffffffffffffdaf,
                                    CONCAT16(in_stack_fffffffffffffdae,
                                             CONCAT24(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8))),
                           (CScript *)in_stack_fffffffffffffda0);
        TVar3 = Solver((CScript *)in_stack_fffffffffffffec8,
                       (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)in_stack_fffffffffffffec0);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::pop_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator=((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffdaf,
                                CONCAT16(in_stack_fffffffffffffdae,
                                         CONCAT24(in_stack_fffffffffffffdac,
                                                  in_stack_fffffffffffffda8))),
                    (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)in_stack_fffffffffffffda0);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::clear((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      }
    }
    if ((TVar3 == MULTISIG) &&
       (bVar1 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::empty((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffdaf,
                                    CONCAT16(in_stack_fffffffffffffdae,
                                             CONCAT24(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8)))), !bVar1)) {
      sVar4 = std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      if (sVar4 < 2) {
        __assert_fail("solutions.size() > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/sign.cpp"
                      ,0x291,
                      "SignatureData DataFromTransaction(const CMutableTransaction &, unsigned int, const CTxOut &)"
                     );
      }
      sVar4 = std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      local_1d0 = 0;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::begin((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)in_stack_fffffffffffffda0);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::end((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffffda0);
      while (bVar1 = __gnu_cxx::
                     operator==<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               ((__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffdaf,
                                            CONCAT16(in_stack_fffffffffffffdae,
                                                     CONCAT24(in_stack_fffffffffffffdac,
                                                              in_stack_fffffffffffffda8))),
                                (__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                 *)in_stack_fffffffffffffda0), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator*((__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        for (local_1e4 = local_1d0; local_1e4 < (int)sVar4 - 2U; local_1e4 = local_1e4 + 1) {
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffdaf,
                                   CONCAT16(in_stack_fffffffffffffdae,
                                            CONCAT24(in_stack_fffffffffffffdac,
                                                     in_stack_fffffffffffffda8))),
                       (size_type)in_stack_fffffffffffffda0);
          pmVar5 = &in_RDI->signatures;
          Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<const_unsigned_char> *)
                     CONCAT17(in_stack_fffffffffffffdaf,
                              CONCAT16(in_stack_fffffffffffffdae,
                                       CONCAT24(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
                                      )),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffda0,
                     (type)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          _vch.m_size = (size_t)pmVar5;
          _vch.m_data = in_stack_fffffffffffffdb0._M_current;
          CPubKey::CPubKey((CPubKey *)
                           CONCAT17(in_stack_fffffffffffffdaf,
                                    CONCAT16(in_stack_fffffffffffffdae,
                                             CONCAT24(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8))),_vch);
          CPubKey::GetID(in_stack_fffffffffffffdc0);
          in_stack_fffffffffffffdb0._M_current =
               (uchar *)std::
                        map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                        ::count((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffdaf,
                                            CONCAT16(in_stack_fffffffffffffdae,
                                                     CONCAT24(in_stack_fffffffffffffdac,
                                                              in_stack_fffffffffffffda8))),
                                (key_type *)in_stack_fffffffffffffda0);
          in_stack_fffffffffffffdaf = true;
          if ((CMutableTransaction *)in_stack_fffffffffffffdb0._M_current ==
              (CMutableTransaction *)0x0) {
            in_stack_fffffffffffffdae =
                 anon_unknown.dwarf_2a5940::SignatureExtractorChecker::CheckECDSASignature
                           ((SignatureExtractorChecker *)this,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            CONCAT44(uVar6,TVar2),scriptCode,
                            (SigVersion)((ulong)in_stack_fffffffffffffde8 >> 0x20));
            in_stack_fffffffffffffdaf = in_stack_fffffffffffffdae;
          }
          if ((bool)in_stack_fffffffffffffdaf != false) {
            local_1d0 = local_1e4 + 1;
            break;
          }
        }
        __gnu_cxx::
        __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator++((__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      }
    }
    CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffdaf,
                          CONCAT16(in_stack_fffffffffffffdae,
                                   CONCAT24(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))));
  }
  anon_unknown.dwarf_2a5940::Stacks::~Stacks
            ((Stacks *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

SignatureData DataFromTransaction(const CMutableTransaction& tx, unsigned int nIn, const CTxOut& txout)
{
    SignatureData data;
    assert(tx.vin.size() > nIn);
    data.scriptSig = tx.vin[nIn].scriptSig;
    data.scriptWitness = tx.vin[nIn].scriptWitness;
    Stacks stack(data);

    // Get signatures
    MutableTransactionSignatureChecker tx_checker(&tx, nIn, txout.nValue, MissingDataBehavior::FAIL);
    SignatureExtractorChecker extractor_checker(data, tx_checker);
    if (VerifyScript(data.scriptSig, txout.scriptPubKey, &data.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, extractor_checker)) {
        data.complete = true;
        return data;
    }

    // Get scripts
    std::vector<std::vector<unsigned char>> solutions;
    TxoutType script_type = Solver(txout.scriptPubKey, solutions);
    SigVersion sigversion = SigVersion::BASE;
    CScript next_script = txout.scriptPubKey;

    if (script_type == TxoutType::SCRIPTHASH && !stack.script.empty() && !stack.script.back().empty()) {
        // Get the redeemScript
        CScript redeem_script(stack.script.back().begin(), stack.script.back().end());
        data.redeem_script = redeem_script;
        next_script = std::move(redeem_script);

        // Get redeemScript type
        script_type = Solver(next_script, solutions);
        stack.script.pop_back();
    }
    if (script_type == TxoutType::WITNESS_V0_SCRIPTHASH && !stack.witness.empty() && !stack.witness.back().empty()) {
        // Get the witnessScript
        CScript witness_script(stack.witness.back().begin(), stack.witness.back().end());
        data.witness_script = witness_script;
        next_script = std::move(witness_script);

        // Get witnessScript type
        script_type = Solver(next_script, solutions);
        stack.witness.pop_back();
        stack.script = std::move(stack.witness);
        stack.witness.clear();
        sigversion = SigVersion::WITNESS_V0;
    }
    if (script_type == TxoutType::MULTISIG && !stack.script.empty()) {
        // Build a map of pubkey -> signature by matching sigs to pubkeys:
        assert(solutions.size() > 1);
        unsigned int num_pubkeys = solutions.size()-2;
        unsigned int last_success_key = 0;
        for (const valtype& sig : stack.script) {
            for (unsigned int i = last_success_key; i < num_pubkeys; ++i) {
                const valtype& pubkey = solutions[i+1];
                // We either have a signature for this pubkey, or we have found a signature and it is valid
                if (data.signatures.count(CPubKey(pubkey).GetID()) || extractor_checker.CheckECDSASignature(sig, pubkey, next_script, sigversion)) {
                    last_success_key = i + 1;
                    break;
                }
            }
        }
    }

    return data;
}